

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_TestShell::createTest
          (TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_TestShell *this)

{
  Utest *this_00;
  TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0xd3);
  TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test::
  TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test
            ((TEST_MockCallTest_expectNoCallDoesntInfluenceExpectOneCall_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, expectNoCallDoesntInfluenceExpectOneCall)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    expectations.addFunction("influence")->callWasMade(1);
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().expectOneCall("influence");
    mock().actualCall("influence");
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}